

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

int lws_buflist_aware_finished_consuming(lws *wsi,lws_tokens *ebuf,int used,int buffered,char *hint)

{
  char cVar1;
  lws_context *plVar2;
  int iVar3;
  size_t sVar4;
  lws_log_cx *plVar5;
  int m;
  lws_context_per_thread *pt;
  char *hint_local;
  int buffered_local;
  int used_local;
  lws_tokens *ebuf_local;
  lws *wsi_local;
  
  plVar2 = (wsi->a).context;
  cVar1 = wsi->tsi;
  if ((used != 0) || (buffered == 0)) {
    if ((used == 0) || (buffered == 0)) {
      if (((used < ebuf->len) && (-1 < ebuf->len)) && (-1 < used)) {
        iVar3 = lws_buflist_append_segment
                          (&wsi->buflist,ebuf->token + used,(ulong)(uint)(ebuf->len - used));
        if (iVar3 < 0) {
          return 1;
        }
        if (iVar3 != 0) {
          plVar5 = lwsl_wsi_get_cx(wsi);
          _lws_log_cx(plVar5,lws_log_prepend_wsi,wsi,0x10,"lws_buflist_aware_finished_consuming",
                      "added to rxflow list");
          iVar3 = lws_dll2_is_detached(&wsi->dll_buflist);
          if (iVar3 != 0) {
            lws_dll2_add_head(&wsi->dll_buflist,&plVar2->pt[(int)cVar1].dll_buflist_owner);
          }
        }
      }
    }
    else if ((wsi->buflist == (lws_buflist *)0x0) ||
            (sVar4 = lws_buflist_use_segment(&wsi->buflist,(long)used), (int)sVar4 == 0)) {
      plVar5 = lwsl_wsi_get_cx(wsi);
      _lws_log_cx(plVar5,lws_log_prepend_wsi,wsi,8,"lws_buflist_aware_finished_consuming",
                  "removed from dll_buflist");
      lws_dll2_remove(&wsi->dll_buflist);
    }
  }
  return 0;
}

Assistant:

int
lws_buflist_aware_finished_consuming(struct lws *wsi, struct lws_tokens *ebuf,
				     int used, int buffered, const char *hint)
{
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];
	int m;

	/* it's in the buflist; we didn't use any */

	if (!used && buffered)
		return 0;

	if (used && buffered) {
		if (wsi->buflist) {
			m = (int)lws_buflist_use_segment(&wsi->buflist,
							 (size_t)used);
			if (m)
				return 0;
		}

		lwsl_wsi_info(wsi, "removed from dll_buflist");
		lws_dll2_remove(&wsi->dll_buflist);

		return 0;
	}

	/* any remainder goes on the buflist */

	if (used < ebuf->len && ebuf->len >= 0 && used >= 0) {
		m = lws_buflist_append_segment(&wsi->buflist,
					       ebuf->token + used,
					       (unsigned int)(ebuf->len - used));
		if (m < 0)
			return 1; /* OOM */
		if (m) {
			lwsl_wsi_debug(wsi, "added to rxflow list");
			if (lws_dll2_is_detached(&wsi->dll_buflist))
				lws_dll2_add_head(&wsi->dll_buflist,
					 &pt->dll_buflist_owner);
		}
	}

	return 0;
}